

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

vector<RPCArg,_std::allocator<RPCArg>_> *
wallet::FundTxDoc(vector<RPCArg,_std::allocator<RPCArg>_> *__return_storage_ptr__,bool solving_data)

{
  size_type *psVar1;
  string name;
  string default_info;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  string name_06;
  string name_07;
  string name_08;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  vector<RPCArg,_std::allocator<RPCArg>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_00;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_01;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_02;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  RPCArgOptions opts_04;
  pointer *ppRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCArg> __l_03;
  undefined8 in_stack_ffffffffffffed68;
  undefined1 *puVar6;
  undefined8 in_stack_ffffffffffffed70;
  undefined8 in_stack_ffffffffffffed78;
  undefined8 in_stack_ffffffffffffed80;
  _Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
  in_stack_ffffffffffffed88;
  undefined1 in_stack_ffffffffffffede8 [16];
  undefined1 in_stack_ffffffffffffedf8;
  undefined7 in_stack_ffffffffffffedf9;
  undefined8 in_stack_ffffffffffffee00;
  undefined8 in_stack_ffffffffffffee08;
  undefined1 in_stack_ffffffffffffee10;
  undefined1 uVar7;
  undefined7 in_stack_ffffffffffffee11;
  pointer in_stack_ffffffffffffee18;
  pointer in_stack_ffffffffffffee20;
  undefined2 in_stack_ffffffffffffee28;
  undefined6 in_stack_ffffffffffffee2a;
  undefined2 in_stack_ffffffffffffee30;
  undefined8 in_stack_ffffffffffffee32;
  undefined6 in_stack_ffffffffffffee3a;
  undefined1 in_stack_ffffffffffffee40;
  undefined7 in_stack_ffffffffffffee41;
  undefined8 in_stack_ffffffffffffee48;
  undefined1 *puVar8;
  undefined1 local_11a8;
  undefined7 uStack_11a7;
  undefined1 local_1198 [32];
  undefined1 local_1178;
  undefined1 *local_1170;
  undefined8 local_1168;
  undefined1 local_1160;
  undefined7 uStack_115f;
  undefined1 local_1150 [32];
  long *local_1130 [2];
  long local_1120 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1110;
  undefined1 local_10b8;
  long *local_10b0 [2];
  long local_10a0 [2];
  RPCArg local_1090;
  long *local_f88 [2];
  long local_f78 [2];
  undefined1 *local_f68;
  undefined8 local_f60;
  undefined1 local_f58;
  uint7 uStack_f57;
  undefined4 local_f4f;
  undefined2 local_f4b;
  undefined1 local_f49;
  undefined4 local_f48;
  undefined1 *local_f40;
  undefined8 local_f38;
  undefined1 local_f30;
  uint7 uStack_f2f;
  undefined4 uStack_f27;
  undefined2 uStack_f23;
  undefined1 uStack_f21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f20;
  vector<UniValue,_std::allocator<UniValue>_> vStack_f08;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_ef0;
  undefined1 local_e98;
  long *local_e90 [2];
  long local_e80 [2];
  undefined1 local_e70 [8];
  undefined1 *local_e68;
  undefined8 local_e60;
  undefined1 local_e58;
  undefined7 uStack_e57;
  undefined1 local_e48 [32];
  undefined1 local_e28;
  undefined1 *local_e20;
  undefined8 local_e18;
  undefined1 local_e10;
  undefined7 uStack_e0f;
  undefined1 local_e00 [32];
  long *local_de0 [2];
  long local_dd0 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_dc0;
  undefined1 local_d68;
  long *local_d60 [2];
  long local_d50 [2];
  RPCArg local_d40;
  long *local_c38 [2];
  long local_c28 [2];
  undefined1 *local_c18;
  undefined8 local_c10;
  undefined1 local_c08;
  uint7 uStack_c07;
  undefined4 local_bff;
  undefined2 local_bfb;
  undefined1 local_bf9;
  undefined4 local_bf8;
  undefined1 *local_bf0;
  undefined8 local_be8;
  undefined1 local_be0;
  uint7 uStack_bdf;
  undefined4 uStack_bd7;
  undefined2 uStack_bd3;
  undefined1 uStack_bd1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_bd0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_bb8;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_ba0;
  undefined1 local_b48;
  long *local_b40 [2];
  long local_b30 [2];
  undefined1 local_b20 [8];
  undefined1 *local_b18;
  undefined8 local_b10;
  undefined1 local_b08;
  undefined7 uStack_b07;
  undefined1 local_af8 [32];
  undefined1 local_ad8;
  undefined1 *local_ad0;
  undefined8 local_ac8;
  undefined1 local_ac0;
  undefined7 uStack_abf;
  undefined1 local_ab0 [32];
  long *local_a90 [2];
  long local_a80 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_a70;
  undefined1 local_a18;
  long *local_a10 [2];
  long local_a00 [2];
  RPCArg local_9f0;
  long *local_8e8 [2];
  long local_8d8 [2];
  undefined1 *local_8c8;
  undefined8 local_8c0;
  undefined1 local_8b8;
  uint7 uStack_8b7;
  undefined4 local_8af;
  undefined2 local_8ab;
  undefined1 local_8a9;
  undefined4 local_8a8 [2];
  undefined1 *local_8a0;
  undefined8 local_898;
  undefined1 local_890;
  uint7 uStack_88f;
  undefined4 uStack_887;
  undefined2 uStack_883;
  undefined1 uStack_881;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_880;
  vector<UniValue,_std::allocator<UniValue>_> vStack_868;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_850;
  undefined1 local_7f8;
  long *local_7f0 [2];
  long local_7e0 [2];
  long *local_7d0 [2];
  long local_7c0 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_7b0;
  undefined1 local_758;
  long *local_750 [2];
  long local_740 [2];
  undefined1 local_730 [16];
  undefined1 local_720 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_718;
  pointer local_708;
  pointer pRStack_700;
  pointer local_6f8;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_6f0;
  _Alloc_hider local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680;
  _Alloc_hider local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_658;
  _Uninitialized<RPCArg::Optional,_true> local_648 [8];
  undefined1 local_628;
  undefined1 *local_620;
  undefined8 local_618;
  undefined1 local_610;
  undefined7 uStack_60f;
  undefined1 local_600 [32];
  long *local_5e0 [2];
  long local_5d0 [2];
  undefined1 local_5c0 [88];
  __index_type local_568;
  long *local_560 [2];
  long local_550 [2];
  undefined1 local_540;
  undefined1 *local_538;
  undefined8 local_530;
  undefined1 local_528;
  undefined7 uStack_527;
  undefined1 local_518 [25];
  undefined1 local_4ff;
  long *local_4f8 [2];
  long local_4e8 [2];
  size_type *local_4d8;
  size_type local_4d0;
  size_type local_4c8;
  undefined8 uStack_4c0;
  undefined1 local_4b8 [88];
  undefined1 local_460;
  long *local_458 [2];
  long local_448 [2];
  undefined1 local_438;
  vector<RPCArg,_std::allocator<RPCArg>_> local_430;
  undefined1 auStack_418 [8];
  undefined1 local_410 [25];
  undefined1 local_3f7;
  long *local_3f0 [2];
  long local_3e0 [2];
  undefined1 local_3d0 [24];
  long alStack_3b8 [8];
  __index_type local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  RPCArg local_350;
  RPCArg local_248;
  RPCArg local_140;
  long local_38;
  
  local_1090.m_fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_370.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_370.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"conf_target","");
  paVar4 = &local_9f0.m_names.field_2;
  local_9f0.m_names._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f0,"wallet -txconfirmtarget","")
  ;
  local_3d0._0_8_ = local_3d0 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_names._M_dataplus._M_p == paVar4) {
    alStack_3b8[0]._0_4_ = local_9f0.m_names.field_2._8_4_;
    alStack_3b8[0]._4_4_ = local_9f0.m_names.field_2._12_4_;
  }
  else {
    local_3d0._0_8_ = local_9f0.m_names._M_dataplus._M_p;
  }
  local_3d0._8_8_ = local_9f0.m_names._M_string_length;
  local_9f0.m_names._M_string_length = 0;
  local_9f0.m_names.field_2._M_allocated_capacity._0_4_ =
       local_9f0.m_names.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_378 = '\x01';
  local_3f0[0] = local_3e0;
  local_9f0.m_names._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f0,"Confirmation target in blocks","");
  ppRVar2 = (pointer *)
            ((long)&local_430.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10);
  local_438 = 0;
  local_430.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_430.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_410._0_8_ = (pointer)0x0;
  local_410[8] = 0;
  local_410._9_7_ = 0;
  local_410[0x10] = 0;
  local_410._17_8_ = 0;
  local_3f7 = 1;
  name._M_string_length = in_stack_ffffffffffffed70;
  name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed68;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffed78;
  name.field_2._8_8_ = in_stack_ffffffffffffed80;
  description.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description.field_2._8_8_ = in_stack_ffffffffffffee00;
  opts.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts._0_8_ = in_stack_ffffffffffffee08;
  opts.oneline_description._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffee11;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffee18;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts.hidden = (bool)(char)in_stack_ffffffffffffee48;
  opts.also_positional = (bool)(char)((ulong)in_stack_ffffffffffffee48 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_ffffffffffffee48 >> 0x10);
  local_430.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppRVar2;
  ::RPCArg::RPCArg(&local_350,name,(Type)&local_370,(Fallback)in_stack_ffffffffffffed88,description,
                   opts);
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"estimate_mode","");
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>((UniValue *)local_730,(char (*) [6])"unset");
  local_4b8._8_8_ = (long)local_4b8 + 0x18;
  local_4b8._0_4_ = local_730._0_4_;
  if ((_Uninitialized<RPCArg::Optional,_true> *)local_730._8_8_ ==
      (_Uninitialized<RPCArg::Optional,_true> *)((long)local_720 + 8U)) {
    local_4b8._32_8_ = local_718._8_8_;
  }
  else {
    local_4b8._8_8_ = local_730._8_8_;
  }
  local_4b8._16_8_ = local_720;
  local_720 = (undefined1  [8])0x0;
  local_718._M_local_buf[0] = '\0';
  local_4b8._40_8_ = local_708;
  local_4b8._48_8_ = pRStack_700;
  local_4b8._56_8_ = local_6f8;
  local_708 = (pointer)0x0;
  pRStack_700 = (pointer)0x0;
  local_6f8 = (pointer)0x0;
  local_4b8._64_4_ = local_6f0._M_first._M_storage;
  local_4b8._68_4_ = local_6f0._4_4_;
  local_4b8._72_4_ = local_6f0._8_4_;
  local_4b8._76_4_ = local_6f0._12_4_;
  local_4b8._80_8_ = local_6f0._16_8_;
  local_6f0._0_8_ = (pointer)0x0;
  local_6f0._8_8_ = (pointer)0x0;
  local_6f0._16_8_ = (pointer)0x0;
  local_460 = 2;
  local_4f8[0] = local_4e8;
  local_730._8_8_ = (_Uninitialized<RPCArg::Optional,_true> *)((long)local_720 + 8U);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f8,
             "economical mode is used if the transaction is replaceable;\notherwise, conservative mode is used"
             ,"");
  default_info._M_string_length = in_stack_ffffffffffffed70;
  default_info._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed68;
  default_info.field_2._M_allocated_capacity = in_stack_ffffffffffffed78;
  default_info.field_2._8_8_ = in_stack_ffffffffffffed80;
  common::FeeModesDetail(&local_d40.m_names,default_info);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_d40.m_names,0,0,
                      "The fee estimate mode, must be one of (case insensitive):\n",0x3a);
  local_4d8 = &local_4c8;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar4) {
    local_4c8 = paVar4->_M_allocated_capacity;
    uStack_4c0 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_4c8 = paVar4->_M_allocated_capacity;
    local_4d8 = psVar1;
  }
  local_4d0 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_540 = 0;
  local_530 = 0;
  local_528 = 0;
  local_518._0_8_ = (pointer)0x0;
  local_518[8] = 0;
  local_518._9_7_ = 0;
  local_518[0x10] = 0;
  local_518._17_8_ = 0;
  local_4ff = 1;
  name_00._M_string_length = in_stack_ffffffffffffed70;
  name_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed68;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffed78;
  name_00.field_2._8_8_ = in_stack_ffffffffffffed80;
  description_00.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_00._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_00.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_00.field_2._8_8_ = in_stack_ffffffffffffee00;
  opts_00.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts_00._0_8_ = in_stack_ffffffffffffee08;
  opts_00.oneline_description._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffee11;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffee18;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts_00.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts_00.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts_00.hidden = (bool)(char)in_stack_ffffffffffffee48;
  opts_00.also_positional = (bool)(char)((ulong)in_stack_ffffffffffffee48 >> 8);
  opts_00._66_6_ = (int6)((ulong)in_stack_ffffffffffffee48 >> 0x10);
  local_538 = &local_528;
  ::RPCArg::RPCArg(&local_248,name_00,(Type)local_458,(Fallback)in_stack_ffffffffffffed88,
                   description_00,opts_00);
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"replaceable","");
  paVar4 = &local_1090.m_names.field_2;
  local_1090.m_names._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1090,"wallet default","");
  local_5c0._0_8_ = local_5c0 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1090.m_names._M_dataplus._M_p == paVar4) {
    local_5c0._24_4_ = local_1090.m_names.field_2._8_4_;
    local_5c0._28_4_ = local_1090.m_names.field_2._12_4_;
  }
  else {
    local_5c0._0_8_ = local_1090.m_names._M_dataplus._M_p;
  }
  local_5c0._8_8_ = local_1090.m_names._M_string_length;
  local_1090.m_names._M_string_length = 0;
  local_1090.m_names.field_2._M_allocated_capacity._0_4_ =
       local_1090.m_names.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_568 = '\x01';
  local_5e0[0] = local_5d0;
  local_1090.m_names._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5e0,
             "Marks this transaction as BIP125-replaceable.\nAllows this transaction to be replaced by a transaction with higher fees"
             ,"");
  local_628 = 0;
  local_618 = 0;
  local_610 = 0;
  local_600._0_8_ = (pointer)0x0;
  local_600._8_2_ = 0;
  local_600._10_6_ = 0;
  local_600._16_2_ = 0;
  local_600._18_8_ = 0;
  name_01._M_string_length = in_stack_ffffffffffffed70;
  name_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed68;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffed78;
  name_01.field_2._8_8_ = in_stack_ffffffffffffed80;
  description_01.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_01._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_01.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_01.field_2._8_8_ = in_stack_ffffffffffffee00;
  opts_01.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts_01._0_8_ = in_stack_ffffffffffffee08;
  opts_01.oneline_description._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffee11;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffee18;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts_01.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts_01.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts_01.hidden = (bool)(char)in_stack_ffffffffffffee48;
  opts_01.also_positional = (bool)(char)((ulong)in_stack_ffffffffffffee48 >> 8);
  opts_01._66_6_ = (int6)((ulong)in_stack_ffffffffffffee48 >> 0x10);
  local_620 = &local_610;
  ::RPCArg::RPCArg(&local_140,name_01,(Type)local_560,(Fallback)in_stack_ffffffffffffed88,
                   description_01,opts_01);
  __l._M_len = 3;
  __l._M_array = &local_350;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            (__return_storage_ptr__,__l,(allocator_type *)local_8a8);
  lVar5 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_370.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar5));
    if ((long *)(local_3d0 + lVar5 + 0x50) != *(long **)(local_3d0 + lVar5 + 0x40)) {
      operator_delete(*(long **)(local_3d0 + lVar5 + 0x40),*(long *)(local_3d0 + lVar5 + 0x50) + 1);
    }
    if ((long *)(local_3d0 + lVar5 + 0x28) != *(long **)(local_3d0 + lVar5 + 0x18)) {
      operator_delete(*(long **)(local_3d0 + lVar5 + 0x18),*(long *)(local_3d0 + lVar5 + 0x28) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_418 + lVar5));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_430.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar5
               ));
    if ((long *)((long)local_448 + lVar5) != *(long **)((long)local_458 + lVar5)) {
      operator_delete(*(long **)((long)local_458 + lVar5),*(long *)((long)local_448 + lVar5) + 1);
    }
    lVar5 = lVar5 + -0x108;
  } while (lVar5 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_600);
  if (local_620 != &local_610) {
    operator_delete(local_620,CONCAT71(uStack_60f,local_610) + 1);
  }
  if (local_5e0[0] != local_5d0) {
    operator_delete(local_5e0[0],local_5d0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1090.m_names._M_dataplus._M_p != &local_1090.m_names.field_2) {
    operator_delete(local_1090.m_names._M_dataplus._M_p,
                    CONCAT44(local_1090.m_names.field_2._M_allocated_capacity._4_4_,
                             local_1090.m_names.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_560[0] != local_550) {
    operator_delete(local_560[0],local_550[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_518);
  if (local_538 != &local_528) {
    operator_delete(local_538,CONCAT71(uStack_527,local_528) + 1);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,local_4c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d40.m_names._M_dataplus._M_p != &local_d40.m_names.field_2) {
    operator_delete(local_d40.m_names._M_dataplus._M_p,
                    local_d40.m_names.field_2._M_allocated_capacity + 1);
  }
  if (local_4f8[0] != local_4e8) {
    operator_delete(local_4f8[0],local_4e8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&((_Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                            *)local_4b8)->_M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_6f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_708);
  if ((_Uninitialized<RPCArg::Optional,_true> *)local_730._8_8_ !=
      (_Uninitialized<RPCArg::Optional,_true> *)((long)local_720 + 8U)) {
    operator_delete((void *)local_730._8_8_,
                    CONCAT71(local_718._M_allocated_capacity._1_7_,local_718._M_local_buf[0]) + 1);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_410);
  if (local_430.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)ppRVar2) {
    operator_delete(local_430.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_430.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_430.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_3f0[0] != local_3e0) {
    operator_delete(local_3f0[0],local_3e0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_names._M_dataplus._M_p != &local_9f0.m_names.field_2) {
    operator_delete(local_9f0.m_names._M_dataplus._M_p,
                    CONCAT44(local_9f0.m_names.field_2._M_allocated_capacity._4_4_,
                             local_9f0.m_names.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_370.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_370.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_370.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_370.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  local_750[0] = local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"solving_data","");
  local_7b0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_758 = 0;
  local_7d0[0] = local_7c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7d0,
             "Keys and scripts needed for producing a final transaction with a dummy signature.\nUsed for fee estimation during coin selection."
             ,"");
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7f0,"pubkeys","");
  local_8c8 = &local_8b8;
  local_8c0 = 0;
  local_8a0 = &local_890;
  local_8a8[0] = 2;
  uStack_88f = uStack_8b7;
  uStack_887 = local_8af;
  uStack_883 = local_8ab;
  uStack_881 = local_8a9;
  local_8b8 = 0;
  local_850._8_8_ = (long)&local_850 + 0x18;
  local_850._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)2;
  local_850._24_8_ = (ulong)uStack_8b7 << 8;
  local_850._16_8_ = 0;
  local_898 = 0;
  local_890 = 0;
  local_850._40_8_ = 0;
  local_850._48_8_ = 0;
  local_850._56_8_ = 0;
  local_880.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_880.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_880.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_850._64_4_ = 0;
  local_850._68_4_ = 0;
  local_850._72_4_ = 0;
  local_850._76_4_ = 0;
  local_850._80_8_ = 0;
  vStack_868.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  vStack_868.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_868.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_7f8 = 2;
  local_8e8[0] = local_8d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8e8,"Public keys involved in this transaction.","");
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"pubkey","");
  local_a70._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_a18 = 0;
  local_a90[0] = local_a80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a90,"A public key","");
  local_ad0 = &local_ac0;
  local_ad8 = 0;
  local_ac8 = 0;
  local_ac0 = 0;
  local_ab0._0_8_ = (pointer)0x0;
  local_ab0._8_2_ = 0;
  local_ab0._10_6_ = 0;
  local_ab0._16_2_ = 0;
  local_ab0._18_8_ = 0;
  name_02._M_string_length = in_stack_ffffffffffffed70;
  name_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed68;
  name_02.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  name_02.field_2._8_8_ = in_stack_ffffffffffffed80;
  description_02.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_02._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_02.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_02.field_2._8_8_ = in_stack_ffffffffffffee00;
  opts_02.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts_02._0_8_ = in_stack_ffffffffffffee08;
  opts_02.oneline_description._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffee11;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffee18;
  opts_02.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts_02.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts_02.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts_02.hidden = (bool)(char)in_stack_ffffffffffffee48;
  opts_02.also_positional = (bool)(char)((ulong)in_stack_ffffffffffffee48 >> 8);
  opts_02._66_6_ = (int6)((ulong)in_stack_ffffffffffffee48 >> 0x10);
  ::RPCArg::RPCArg(&local_9f0,name_02,(Type)local_a10,(Fallback)in_stack_ffffffffffffed88,
                   description_02,opts_02);
  __l_00._M_len = 1;
  __l_00._M_array = &local_9f0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffedc8,__l_00,
             (allocator_type *)&stack0xffffffffffffedc7);
  local_b18 = &local_b08;
  local_b20[0] = 0;
  local_b10 = 0;
  local_b08 = 0;
  local_af8._0_8_ = (pointer)0x0;
  local_af8._8_2_ = 0;
  local_af8._10_6_ = 0;
  local_af8._16_2_ = 0;
  local_af8._18_8_ = 0;
  puVar6 = local_b20;
  name_03._M_string_length = in_stack_ffffffffffffed70;
  name_03._M_dataplus._M_p = puVar6;
  name_03.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  name_03.field_2._8_8_ = in_stack_ffffffffffffed80;
  description_03.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_03._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_03.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_03.field_2._8_8_ = in_stack_ffffffffffffee00;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = in_stack_ffffffffffffee10;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffee08;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = in_stack_ffffffffffffee11;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffee18;
  ::RPCArg::RPCArg(&local_350,name_03,(Type)local_7f0,(Fallback)in_stack_ffffffffffffed88,
                   description_03,inner,(RPCArgOptions *)0x1);
  local_b40[0] = local_b30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b40,"scripts","");
  local_c18 = &local_c08;
  local_c10 = 0;
  local_bf0 = &local_be0;
  local_bf8 = 2;
  uStack_bdf = uStack_c07;
  uStack_bd7 = local_bff;
  uStack_bd3 = local_bfb;
  uStack_bd1 = local_bf9;
  local_c08 = 0;
  local_ba0._8_8_ = (long)&local_ba0 + 0x18;
  local_ba0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)2;
  local_ba0._24_8_ = (ulong)uStack_c07 << 8;
  local_ba0._16_8_ = 0;
  local_be8 = 0;
  local_be0 = 0;
  local_ba0._40_8_ = 0;
  local_ba0._48_8_ = 0;
  local_ba0._56_8_ = 0;
  local_bd0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bd0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_bd0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ba0._64_4_ = 0;
  local_ba0._68_4_ = 0;
  local_ba0._72_4_ = 0;
  local_ba0._76_4_ = 0;
  local_ba0._80_8_ = 0;
  vStack_bb8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  vStack_bb8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_bb8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_b48 = 2;
  local_c38[0] = local_c28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c38,"Scripts involved in this transaction.","");
  local_d60[0] = local_d50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d60,"script","");
  local_dc0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_d68 = 0;
  local_de0[0] = local_dd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_de0,"A script","");
  local_e20 = &local_e10;
  local_e28 = 0;
  local_e18 = 0;
  local_e10 = 0;
  local_e00._0_8_ = (pointer)0x0;
  local_e00._8_2_ = 0;
  local_e00._10_6_ = 0;
  local_e00._16_2_ = 0;
  local_e00._18_8_ = 0;
  name_04._M_string_length = in_stack_ffffffffffffed70;
  name_04._M_dataplus._M_p = puVar6;
  name_04.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  name_04.field_2._8_8_ = in_stack_ffffffffffffed80;
  description_04.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_04._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_04.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_04.field_2._8_8_ = in_stack_ffffffffffffee00;
  opts_03.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts_03._0_8_ = in_stack_ffffffffffffee08;
  opts_03.oneline_description._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffee11;
  opts_03.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffee18;
  opts_03.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts_03.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts_03.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts_03.hidden = (bool)(char)in_stack_ffffffffffffee48;
  opts_03.also_positional = (bool)(char)((ulong)in_stack_ffffffffffffee48 >> 8);
  opts_03._66_6_ = (int6)((ulong)in_stack_ffffffffffffee48 >> 0x10);
  ::RPCArg::RPCArg(&local_d40,name_04,(Type)local_d60,(Fallback)in_stack_ffffffffffffed88,
                   description_04,opts_03);
  __l_01._M_len = 1;
  __l_01._M_array = &local_d40;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffeda8,__l_01,
             (allocator_type *)&stack0xffffffffffffeda7);
  local_e68 = &local_e58;
  local_e70[0] = 0;
  local_e60 = 0;
  local_e58 = 0;
  local_e48._0_8_ = (pointer)0x0;
  local_e48._8_2_ = 0;
  local_e48._10_6_ = 0;
  local_e48._16_2_ = 0;
  local_e48._18_8_ = 0;
  puVar6 = local_e70;
  name_05._M_string_length = in_stack_ffffffffffffed70;
  name_05._M_dataplus._M_p = puVar6;
  name_05.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  name_05.field_2._8_8_ = in_stack_ffffffffffffed80;
  description_05.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_05._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_05.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_05.field_2._8_8_ = in_stack_ffffffffffffee00;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = in_stack_ffffffffffffee10;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffee08;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = in_stack_ffffffffffffee11;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffee18;
  ::RPCArg::RPCArg(&local_248,name_05,(Type)local_b40,(Fallback)in_stack_ffffffffffffed88,
                   description_05,inner_00,(RPCArgOptions *)0x1);
  local_e90[0] = local_e80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e90,"descriptors","");
  local_f68 = &local_f58;
  local_f60 = 0;
  local_f48 = 2;
  uStack_f2f = uStack_f57;
  uStack_f27 = local_f4f;
  uStack_f23 = local_f4b;
  uStack_f21 = local_f49;
  local_f58 = 0;
  local_ef0._8_8_ = (long)&local_ef0 + 0x18;
  local_ef0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)2;
  local_ef0._24_8_ = (ulong)uStack_f57 << 8;
  local_ef0._16_8_ = 0;
  local_f38 = 0;
  local_f30 = 0;
  local_ef0._40_8_ = 0;
  local_ef0._48_8_ = 0;
  local_ef0._56_8_ = 0;
  local_f20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f20.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ef0._64_4_ = 0;
  local_ef0._68_4_ = 0;
  local_ef0._72_4_ = 0;
  local_ef0._76_4_ = 0;
  local_ef0._80_8_ = 0;
  vStack_f08.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  vStack_f08.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_f08.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_e98 = 2;
  local_f88[0] = local_f78;
  local_f40 = &local_f30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f88,"Descriptors that provide solving data for this transaction.","");
  local_10b0[0] = local_10a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10b0,"descriptor","");
  local_1110._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_10b8 = 0;
  local_1130[0] = local_1120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1130,"A descriptor","");
  local_1170 = &local_1160;
  local_1178 = 0;
  local_1168 = 0;
  local_1160 = 0;
  local_1150._0_8_ = (pointer)0x0;
  local_1150._8_2_ = 0;
  local_1150._10_6_ = 0;
  local_1150._16_2_ = 0;
  local_1150._18_8_ = 0;
  name_06._M_string_length = in_stack_ffffffffffffed70;
  name_06._M_dataplus._M_p = puVar6;
  name_06.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  name_06.field_2._8_8_ = in_stack_ffffffffffffed80;
  description_06.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_06._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_06.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_06.field_2._8_8_ = in_stack_ffffffffffffee00;
  opts_04.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts_04._0_8_ = in_stack_ffffffffffffee08;
  opts_04.oneline_description._M_dataplus._M_p._1_7_ = in_stack_ffffffffffffee11;
  opts_04.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffee18;
  opts_04.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts_04.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts_04.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts_04.hidden = (bool)(char)in_stack_ffffffffffffee48;
  opts_04.also_positional = (bool)(char)((ulong)in_stack_ffffffffffffee48 >> 8);
  opts_04._66_6_ = (int6)((ulong)in_stack_ffffffffffffee48 >> 0x10);
  ::RPCArg::RPCArg(&local_1090,name_06,(Type)local_10b0,(Fallback)in_stack_ffffffffffffed88,
                   description_06,opts_04);
  __l_02._M_len = 1;
  __l_02._M_array = &local_1090;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffed88,__l_02,
             (allocator_type *)&stack0xffffffffffffed87);
  local_11a8 = 0;
  local_1198._0_8_ = (pointer)0x0;
  local_1198._8_2_ = 0;
  local_1198._10_6_ = 0;
  local_1198._16_2_ = 0;
  local_1198._18_8_ = 0;
  name_07._M_string_length = in_stack_ffffffffffffed70;
  name_07._M_dataplus._M_p = &stack0xffffffffffffee40;
  name_07.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  name_07.field_2._8_8_ = in_stack_ffffffffffffed80;
  description_07.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_07._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_07.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_07.field_2._8_8_ = in_stack_ffffffffffffee00;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = in_stack_ffffffffffffee10;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffee08;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = in_stack_ffffffffffffee11;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffee18;
  puVar8 = &local_11a8;
  ::RPCArg::RPCArg(&local_140,name_07,(Type)local_e90,(Fallback)in_stack_ffffffffffffed88,
                   description_07,inner_01,(RPCArgOptions *)0x1);
  __l_03._M_len = 3;
  __l_03._M_array = &local_350;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffede0,__l_03,
             (allocator_type *)&stack0xffffffffffffed86);
  uVar7 = 0;
  name_08._M_string_length = in_stack_ffffffffffffed70;
  name_08._M_dataplus._M_p = &stack0xffffffffffffedf8;
  name_08.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
  name_08.field_2._8_8_ = in_stack_ffffffffffffed80;
  description_08.field_2._M_local_buf[0] = 0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_08._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_08.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_08.field_2._8_8_ = &stack0xffffffffffffee10;
  inner_02.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = in_stack_ffffffffffffee11;
  inner_02.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._0_9_
       = (unkuint9)0;
  inner_02.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffee18;
  puVar6 = &stack0xffffffffffffee10;
  ::RPCArg::RPCArg((RPCArg *)local_730,name_08,(Type)local_750,(Fallback)in_stack_ffffffffffffed88,
                   description_08,inner_02,(RPCArgOptions *)0x0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::emplace_back<RPCArg>
            (__return_storage_ptr__,(RPCArg *)local_730);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_648);
  if ((_Uninitialized<RPCArg::Optional,_true> *)local_668._M_p !=
      (_Uninitialized<RPCArg::Optional,_true> *)&local_658) {
    operator_delete(local_668._M_p,local_658._M_allocated_capacity + 1);
  }
  if ((_Uninitialized<RPCArg::Optional,_true> *)local_690._M_p !=
      (_Uninitialized<RPCArg::Optional,_true> *)&local_680) {
    operator_delete(local_690._M_p,local_680._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_6f0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&local_708);
  if ((_Uninitialized<RPCArg::Optional,_true> *)CONCAT44(local_730._4_4_,local_730._0_4_) !=
      (_Uninitialized<RPCArg::Optional,_true> *)local_720) {
    operator_delete((_Uninitialized<RPCArg::Optional,_true> *)
                    CONCAT44(local_730._4_4_,local_730._0_4_),(long)local_720 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffee20);
  if (puVar6 != &stack0xffffffffffffee10) {
    operator_delete(puVar6,CONCAT71(in_stack_ffffffffffffee11,uVar7) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffede0);
  lVar5 = 0x318;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_370.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar5));
    if ((long *)(local_3d0 + lVar5 + 0x50) != *(long **)(local_3d0 + lVar5 + 0x40)) {
      operator_delete(*(long **)(local_3d0 + lVar5 + 0x40),*(long *)(local_3d0 + lVar5 + 0x50) + 1);
    }
    if ((long *)(local_3d0 + lVar5 + 0x28) != *(long **)(local_3d0 + lVar5 + 0x18)) {
      operator_delete(*(long **)(local_3d0 + lVar5 + 0x18),*(long *)(local_3d0 + lVar5 + 0x28) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_418 + lVar5));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_430.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + lVar5
               ));
    if ((long *)((long)local_448 + lVar5) != *(long **)((long)local_458 + lVar5)) {
      operator_delete(*(long **)((long)local_458 + lVar5),*(long *)((long)local_448 + lVar5) + 1);
    }
    lVar5 = lVar5 + -0x108;
  } while (lVar5 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1198);
  if (puVar8 != &local_11a8) {
    operator_delete(puVar8,CONCAT71(uStack_11a7,local_11a8) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffed88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1090.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1090.m_opts.oneline_description._M_dataplus._M_p !=
      &local_1090.m_opts.oneline_description.field_2) {
    operator_delete(local_1090.m_opts.oneline_description._M_dataplus._M_p,
                    local_1090.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1090.m_description._M_dataplus._M_p != &local_1090.m_description.field_2) {
    operator_delete(local_1090.m_description._M_dataplus._M_p,
                    local_1090.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1090.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1090.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1090.m_names._M_dataplus._M_p != &local_1090.m_names.field_2) {
    operator_delete(local_1090.m_names._M_dataplus._M_p,
                    CONCAT44(local_1090.m_names.field_2._M_allocated_capacity._4_4_,
                             local_1090.m_names.field_2._M_allocated_capacity._0_4_) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1150);
  if (local_1170 != &local_1160) {
    operator_delete(local_1170,CONCAT71(uStack_115f,local_1160) + 1);
  }
  if (local_1130[0] != local_1120) {
    operator_delete(local_1130[0],local_1120[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1110._M_first);
  if (local_10b0[0] != local_10a0) {
    operator_delete(local_10b0[0],local_10a0[0] + 1);
  }
  if (local_f88[0] != local_f78) {
    operator_delete(local_f88[0],local_f78[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_ef0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_f08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f20);
  if (local_f40 != &local_f30) {
    operator_delete(local_f40,CONCAT71(uStack_f2f,local_f30) + 1);
  }
  if (local_f68 != &local_f58) {
    operator_delete(local_f68,CONCAT71(uStack_f57,local_f58) + 1);
  }
  if (local_e90[0] != local_e80) {
    operator_delete(local_e90[0],local_e80[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e48);
  if (local_e68 != &local_e58) {
    operator_delete(local_e68,CONCAT71(uStack_e57,local_e58) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffeda8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d40.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d40.m_opts.oneline_description._M_dataplus._M_p !=
      &local_d40.m_opts.oneline_description.field_2) {
    operator_delete(local_d40.m_opts.oneline_description._M_dataplus._M_p,
                    local_d40.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d40.m_description._M_dataplus._M_p != &local_d40.m_description.field_2) {
    operator_delete(local_d40.m_description._M_dataplus._M_p,
                    local_d40.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_d40.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_d40.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d40.m_names._M_dataplus._M_p != &local_d40.m_names.field_2) {
    operator_delete(local_d40.m_names._M_dataplus._M_p,
                    local_d40.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e00);
  if (local_e20 != &local_e10) {
    operator_delete(local_e20,CONCAT71(uStack_e0f,local_e10) + 1);
  }
  if (local_de0[0] != local_dd0) {
    operator_delete(local_de0[0],local_dd0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_dc0._M_first);
  if (local_d60[0] != local_d50) {
    operator_delete(local_d60[0],local_d50[0] + 1);
  }
  if (local_c38[0] != local_c28) {
    operator_delete(local_c38[0],local_c28[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_ba0._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_bb8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_bd0);
  if (local_bf0 != &local_be0) {
    operator_delete(local_bf0,CONCAT71(uStack_bdf,local_be0) + 1);
  }
  if (local_c18 != &local_c08) {
    operator_delete(local_c18,CONCAT71(uStack_c07,local_c08) + 1);
  }
  if (local_b40[0] != local_b30) {
    operator_delete(local_b40[0],local_b30[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_af8);
  if (local_b18 != &local_b08) {
    operator_delete(local_b18,CONCAT71(uStack_b07,local_b08) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffedc8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9f0.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_opts.oneline_description._M_dataplus._M_p !=
      &local_9f0.m_opts.oneline_description.field_2) {
    operator_delete(local_9f0.m_opts.oneline_description._M_dataplus._M_p,
                    local_9f0.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_description._M_dataplus._M_p != &local_9f0.m_description.field_2) {
    operator_delete(local_9f0.m_description._M_dataplus._M_p,
                    local_9f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_9f0.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_9f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0.m_names._M_dataplus._M_p != &local_9f0.m_names.field_2) {
    operator_delete(local_9f0.m_names._M_dataplus._M_p,
                    CONCAT44(local_9f0.m_names.field_2._M_allocated_capacity._4_4_,
                             local_9f0.m_names.field_2._M_allocated_capacity._0_4_) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_ab0);
  if (local_ad0 != &local_ac0) {
    operator_delete(local_ad0,CONCAT71(uStack_abf,local_ac0) + 1);
  }
  if (local_a90[0] != local_a80) {
    operator_delete(local_a90[0],local_a80[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_a70._M_first);
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0],local_a00[0] + 1);
  }
  if (local_8e8[0] != local_8d8) {
    operator_delete(local_8e8[0],local_8d8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_850._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_868);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_880);
  if (local_8a0 != &local_890) {
    operator_delete(local_8a0,CONCAT71(uStack_88f,local_890) + 1);
  }
  if (local_8c8 != &local_8b8) {
    operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
  }
  if (local_7f0[0] != local_7e0) {
    operator_delete(local_7f0[0],local_7e0[0] + 1);
  }
  if (local_7d0[0] != local_7c0) {
    operator_delete(local_7d0[0],local_7c0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_7b0._M_first);
  if (local_750[0] != local_740) {
    operator_delete(local_750[0],local_740[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<RPCArg> FundTxDoc(bool solving_data = true)
{
    std::vector<RPCArg> args = {
        {"conf_target", RPCArg::Type::NUM, RPCArg::DefaultHint{"wallet -txconfirmtarget"}, "Confirmation target in blocks", RPCArgOptions{.also_positional = true}},
        {"estimate_mode", RPCArg::Type::STR, RPCArg::Default{"unset"}, "The fee estimate mode, must be one of (case insensitive):\n"
          + FeeModesDetail(std::string("economical mode is used if the transaction is replaceable;\notherwise, conservative mode is used")), RPCArgOptions{.also_positional = true}},
        {
            "replaceable", RPCArg::Type::BOOL, RPCArg::DefaultHint{"wallet default"}, "Marks this transaction as BIP125-replaceable.\n"
            "Allows this transaction to be replaced by a transaction with higher fees"
        },
    };
    if (solving_data) {
        args.push_back({"solving_data", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "Keys and scripts needed for producing a final transaction with a dummy signature.\n"
        "Used for fee estimation during coin selection.",
            {
                {
                    "pubkeys", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Public keys involved in this transaction.",
                    {
                        {"pubkey", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "A public key"},
                    }
                },
                {
                    "scripts", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Scripts involved in this transaction.",
                    {
                        {"script", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "A script"},
                    }
                },
                {
                    "descriptors", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Descriptors that provide solving data for this transaction.",
                    {
                        {"descriptor", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "A descriptor"},
                    }
                },
            }
        });
    }
    return args;
}